

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> * __thiscall
cfd::core::JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct>::ConvertToStruct
          (JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct> *this)

{
  bool bVar1;
  vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *in_RSI;
  PsbtBip32DataStruct *in_RDI;
  PsbtBip32DataStruct data;
  PsbtBip32Data *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct> *__range3;
  vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *result;
  vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>
  *in_stack_fffffffffffffee8;
  PsbtBip32DataStruct *__x;
  PsbtBip32Data *in_stack_ffffffffffffff18;
  __normal_iterator<const_cfd::api::json::PsbtBip32Data_*,_std::vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>_>
  local_28 [2];
  undefined1 local_11;
  
  local_11 = 0;
  __x = in_RDI;
  ::std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>::vector
            ((vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *)0x6bb3be);
  local_28[0]._M_current =
       (PsbtBip32Data *)
       ::std::vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>
       ::begin(in_stack_fffffffffffffee8);
  ::std::vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>::end
            (in_stack_fffffffffffffee8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::api::json::PsbtBip32Data_*,_std::vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_cfd::api::json::PsbtBip32Data_*,_std::vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>_>
                             *)in_stack_fffffffffffffee8), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::PsbtBip32Data_*,_std::vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>_>
    ::operator*(local_28);
    cfd::api::json::PsbtBip32Data::ConvertToStruct(in_stack_ffffffffffffff18);
    ::std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>::push_back(in_RSI,__x);
    PsbtBip32DataStruct::~PsbtBip32DataStruct(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::PsbtBip32Data_*,_std::vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>_>
    ::operator++(local_28);
  }
  return (vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *)__x;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }